

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void GenerateOutputControlFontFamily(utf16 *pchFontName,utf16 *pchOutputName)

{
  wstring stu;
  wchar_t rgchw [120];
  allocator local_219;
  wchar_t *local_218;
  long local_210;
  wchar_t local_1f8 [120];
  
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<unsigned_short*,wchar_t*>
            (pchFontName,pchFontName + 0x78,local_1f8);
  std::__cxx11::wstring::wstring((wstring *)&local_218,local_1f8,&local_219);
  std::__cxx11::wstring::append((wchar_t *)&local_218);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<wchar_t_const*,unsigned_short*>(local_218,local_218 + local_210 + 1,pchOutputName);
  std::__cxx11::wstring::~wstring((wstring *)&local_218);
  return;
}

Assistant:

void GenerateOutputControlFontFamily(utf16 * pchFontName, utf16 * pchOutputName)
{
	wchar_t rgchw[120];
	std::copy(pchFontName, pchFontName + 120, rgchw);
	std::wstring stu(rgchw);
	stu.append(L" Graphite");
	std::copy(stu.data(), stu.data() + stu.length() + 1, pchOutputName);
	//utf16cpy(pchOutputName, (const utf16*)stu.Chars());
	//pchOutputName[stu.Length() + 1] = 0;
}